

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

ExtractResult
absl::lts_20250127::cord_internal::CordRepBtree::ExtractAppendBuffer
          (CordRepBtree *tree,size_t extra_capacity)

{
  byte bVar1;
  uint8_t uVar2;
  size_t sVar3;
  CordRepBtree *pCVar4;
  ulong uVar5;
  sbyte sVar6;
  int iVar7;
  CordRepBtree *pCVar8;
  CordRepBtree *pCVar9;
  sbyte sVar10;
  int iVar11;
  long lVar12;
  CordRep *pCVar13;
  CordRepBtree *pCVar14;
  ExtractResult EVar15;
  NodeStack stack;
  long lStack_a8;
  code *apcStack_a0 [14];
  
  pCVar13 = (CordRep *)0x0;
  lVar12 = 0;
  pCVar14 = tree;
  do {
    iVar7 = (pCVar14->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
    pCVar8 = tree;
    if ((pCVar14->super_CordRep).storage[0] == '\0') {
      if (((iVar7 == 2) &&
          (pCVar13 = *(CordRep **)
                      ((pCVar14->super_CordRep).storage +
                      (ulong)(pCVar14->super_CordRep).storage[2] * 8 + -5), 5 < pCVar13->tag)) &&
         ((pCVar13->refcount).count_.super___atomic_base<int>._M_i == 2)) {
        bVar1 = pCVar13->tag;
        if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
          apcStack_a0[0] =
               cord_internal::anon_unknown_0::DumpAll::anon_class_16_2_6856332a::operator();
          __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                        ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
        }
        iVar7 = -0xb8000;
        if (bVar1 < 0xbb) {
          iVar7 = -0xe80;
        }
        sVar10 = 0xc;
        if (bVar1 < 0xbb) {
          sVar10 = 6;
        }
        iVar11 = -0x10;
        if (0x42 < bVar1) {
          iVar11 = iVar7;
        }
        sVar3 = pCVar13->length;
        sVar6 = 3;
        if (0x42 < bVar1) {
          sVar6 = sVar10;
        }
        if (extra_capacity <= (long)(int)(((uint)bVar1 << sVar6) + iVar11 + -0xd) - sVar3)
        goto LAB_004ceed6;
      }
      pCVar13 = (CordRep *)0x0;
      goto LAB_004ceec1;
    }
    if (iVar7 != 2) goto LAB_004ceec1;
    apcStack_a0[lVar12 + 1] = (code *)pCVar14;
    lVar12 = lVar12 + 1;
    pCVar14 = *(CordRepBtree **)
               ((pCVar14->super_CordRep).storage +
               (ulong)(pCVar14->super_CordRep).storage[2] * 8 + -5);
  } while ((pCVar14->super_CordRep).tag == '\x03');
LAB_004cee1e:
  apcStack_a0[0] = (code *)0x4cee3d;
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
LAB_004ceed6:
  bVar1 = (pCVar14->super_CordRep).storage[2];
  if ((ulong)bVar1 - (ulong)(pCVar14->super_CordRep).storage[1] != 1) goto LAB_004cef11;
  if (pCVar14 != (CordRepBtree *)0x0) {
    apcStack_a0[0] = (code *)0x4ceefe;
    operator_delete(pCVar14,0x40);
  }
  if (lVar12 < 1) {
    pCVar8 = (CordRepBtree *)0x0;
    goto LAB_004ceec1;
  }
  pCVar14 = (CordRepBtree *)apcStack_a0[lVar12];
  lVar12 = lVar12 + -1;
  goto LAB_004ceed6;
LAB_004cef11:
  (pCVar14->super_CordRep).storage[2] = bVar1 - 1;
  (pCVar14->super_CordRep).length = (pCVar14->super_CordRep).length - sVar3;
  if (0 < (int)(uint)lVar12) {
    lVar12 = (ulong)((uint)lVar12 & 0x7fffffff) + 1;
    do {
      pCVar14 = (CordRepBtree *)(&lStack_a8)[lVar12];
      (pCVar14->super_CordRep).length = (pCVar14->super_CordRep).length - sVar3;
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  do {
    pCVar8 = pCVar14;
    uVar5 = (ulong)(pCVar8->super_CordRep).storage[2];
    if (uVar5 - (pCVar8->super_CordRep).storage[1] != 1) break;
    uVar2 = (pCVar8->super_CordRep).storage[0];
    pCVar4 = *(CordRepBtree **)((pCVar8->super_CordRep).storage + uVar5 * 8 + -5);
    if (pCVar8 != (CordRepBtree *)0x0) {
      apcStack_a0[0] = (code *)0x4cef57;
      operator_delete(pCVar8,0x40);
    }
    pCVar9 = pCVar4;
    pCVar14 = pCVar8;
    if ((uVar2 != '\0') && (pCVar9 = tree, pCVar14 = pCVar4, (pCVar4->super_CordRep).tag != '\x03'))
    goto LAB_004cee1e;
    pCVar8 = pCVar9;
    tree = pCVar9;
  } while (uVar2 != '\0');
LAB_004ceec1:
  EVar15.extracted = pCVar13;
  EVar15.tree = &pCVar8->super_CordRep;
  return EVar15;
}

Assistant:

CordRepBtree::ExtractResult CordRepBtree::ExtractAppendBuffer(
    CordRepBtree* tree, size_t extra_capacity) {
  int depth = 0;
  NodeStack stack;

  // Set up default 'no success' result which is {tree, nullptr}.
  ExtractResult result;
  result.tree = tree;
  result.extracted = nullptr;

  // Dive down the right side of the tree, making sure no edges are shared.
  while (tree->height() > 0) {
    if (!tree->refcount.IsOne()) return result;
    stack[depth++] = tree;
    tree = tree->Edge(kBack)->btree();
  }
  if (!tree->refcount.IsOne()) return result;

  // Validate we ended on a non shared flat.
  CordRep* rep = tree->Edge(kBack);
  if (!(rep->IsFlat() && rep->refcount.IsOne())) return result;

  // Verify it has at least the requested extra capacity.
  CordRepFlat* flat = rep->flat();
  const size_t length = flat->length;
  const size_t avail = flat->Capacity() - flat->length;
  if (extra_capacity > avail) return result;

  // Set the extracted flat in the result.
  result.extracted = flat;

  // Cascading delete all nodes that become empty.
  while (tree->size() == 1) {
    CordRepBtree::Delete(tree);
    if (--depth < 0) {
      // We consumed the entire tree: return nullptr for new tree.
      result.tree = nullptr;
      return result;
    }
    rep = tree;
    tree = stack[depth];
  }

  // Remove the edge or cascaded up parent node.
  tree->set_end(tree->end() - 1);
  tree->length -= length;

  // Adjust lengths up the tree.
  while (depth > 0) {
    tree = stack[--depth];
    tree->length -= length;
  }

  // Remove unnecessary top nodes with size = 1. This may iterate all the way
  // down to the leaf node in which case we simply return the remaining last
  // edge in that node and the extracted flat.
  while (tree->size() == 1) {
    int height = tree->height();
    rep = tree->Edge(kBack);
    Delete(tree);
    if (height == 0) {
      // We consumed the leaf: return the sole data edge as the new tree.
      result.tree = rep;
      return result;
    }
    tree = rep->btree();
  }

  // Done: return the (new) top level node and extracted flat.
  result.tree = tree;
  return result;
}